

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

result_type * __thiscall
pstore::json::parser<json_out_callbacks>::eof_abi_cxx11_
          (result_type *__return_storage_ptr__,parser<json_out_callbacks> *this)

{
  bool bVar1;
  pointer pmVar2;
  json_out_callbacks *this_00;
  byte local_69;
  maybe<char,_void> local_3a;
  undefined1 local_38 [8];
  pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
  res;
  value_type *handler;
  parser<json_out_callbacks> *this_local;
  
  while( true ) {
    bVar1 = std::
            stack<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>_>
            ::empty(&this->stack_);
    local_69 = 0;
    if (!bVar1) {
      bVar1 = has_error(this);
      local_69 = bVar1 ^ 0xff;
    }
    if ((local_69 & 1) == 0) {
      bVar1 = has_error(this);
      if (bVar1) {
        details::
        default_return<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::get();
      }
      else {
        this_00 = callbacks(this);
        json_out_callbacks::result_abi_cxx11_(__return_storage_ptr__,this_00);
      }
      return __return_storage_ptr__;
    }
    res._16_8_ = std::
                 stack<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>_>
                 ::top(&this->stack_);
    pmVar2 = std::
             unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
             ::operator->((unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                           *)res._16_8_);
    nothing<char>();
    (*pmVar2->_vptr_matcher[2])(local_38,pmVar2,this,&local_3a);
    maybe<char,_void>::~maybe(&local_3a);
    pmVar2 = std::
             unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
             ::operator->((unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
                           *)res._16_8_);
    bVar1 = details::matcher<json_out_callbacks>::is_done(pmVar2);
    if (!bVar1) {
      assert_failed("handler->is_done ()",
                    "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                    ,0x73f);
    }
    if (((byte)res.first._M_t.
               super___uniq_ptr_impl<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>
               .super__Head_base<0UL,_pstore::json::details::matcher<json_out_callbacks>_*,_false>.
               _M_head_impl & 1) == 0) break;
    std::
    stack<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::deque<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_std::allocator<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>_>_>_>
    ::pop(&this->stack_);
    std::
    pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
    ::~pair((pair<std::unique_ptr<pstore::json::details::matcher<json_out_callbacks>,_pstore::json::details::deleter<pstore::json::details::matcher<json_out_callbacks>_>_>,_bool>
             *)local_38);
  }
  assert_failed("res.second",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/json/json.hpp"
                ,0x740);
}

Assistant:

auto parser<Callbacks>::eof () -> result_type {
            while (!stack_.empty () && !has_error ()) {
                auto & handler = stack_.top ();
                auto res = handler->consume (*this, nothing<char> ());
                PSTORE_ASSERT (handler->is_done ());
                PSTORE_ASSERT (res.second);
                stack_.pop (); // release the topmost matcher object.
            }
            return has_error () ? details::default_return<result_type>::get ()
                                : this->callbacks ().result ();
        }